

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sync.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_252d24::SyncFixture::add
          (SyncFixture *this,transaction_type *transaction,string *key,string *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> a;
  size_t num;
  const_iterator __first;
  element_type *__result;
  element_type *this_00;
  uint64_t s;
  extent<char> local_1a0;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_190;
  undefined1 local_98 [8];
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  index;
  tuple<std::shared_ptr<char>&,pstore::typed_address<char>&> local_78 [32];
  pair<std::shared_ptr<char>,_pstore::typed_address<char>_> local_58;
  undefined1 local_40 [8];
  shared_ptr<char> ptr;
  typed_address<char> where;
  string *value_local;
  string *key_local;
  transaction_type *transaction_local;
  SyncFixture *this_local;
  
  ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pstore::typed_address<char>::null();
  std::shared_ptr<char>::shared_ptr((shared_ptr<char> *)local_40);
  num = std::__cxx11::string::length();
  pstore::transaction_base::alloc_rw<char,void>(&local_58,&transaction->super_transaction_base,num);
  std::tie<std::shared_ptr<char>,pstore::typed_address<char>>
            ((shared_ptr<char> *)local_78,(typed_address<char> *)local_40);
  std::tuple<std::shared_ptr<char>&,pstore::typed_address<char>&>::operator=(local_78,&local_58);
  std::pair<std::shared_ptr<char>,_pstore::typed_address<char>_>::~pair(&local_58);
  __first = std::begin<std::__cxx11::string>(value);
  index.
  super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::end<std::__cxx11::string>(value);
  __result = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)local_40);
  std::copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__first._M_current,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )index.
               super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi,__result);
  std::shared_ptr<char>::~shared_ptr((shared_ptr<char> *)local_40);
  pstore::index::
  get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
            ((index *)local_98,&this->db_,true);
  this_00 = std::
            __shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_98);
  a = ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  s = std::__cxx11::string::length();
  local_1a0 = pstore::make_extent<char>((typed_address<char>)a._M_pi,s);
  pstore::index::
  hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
  ::insert_or_assign<std::__cxx11::string,pstore::extent<char>,void>
            (&local_190,
             (hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
              *)this_00,&transaction->super_transaction_base,key,&local_1a0);
  std::
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  ::~pair(&local_190);
  std::
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~shared_ptr((shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_98);
  return;
}

Assistant:

void SyncFixture::add (transaction_type & transaction, std::string const & key,
                           std::string const & value) {

        auto where = pstore::typed_address<char>::null ();
        {
            // Allocate storage for string 'value' and copy the data into it.
            std::shared_ptr<char> ptr;
            std::tie (ptr, where) = transaction.alloc_rw<char> (value.length ());
            std::copy (std::begin (value), std::end (value), ptr.get ());
        }

        auto index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
        index->insert_or_assign (transaction, key, make_extent (where, value.length ()));
    }